

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.h
# Opt level: O3

int __thiscall
pybind11::detail::process_attribute<pybind11::arg,_void>::init
          (process_attribute<pybind11::arg,_void> *this,EVP_PKEY_CTX *ctx)

{
  reference pvVar1;
  void *local_30;
  handle local_28;
  bool local_1a;
  bool local_19;
  
  if ((((byte)ctx[0x59] & 0x10) != 0) && (*(long *)(ctx + 0x18) == *(long *)(ctx + 0x20))) {
    local_30 = (void *)0x0;
    local_28.m_ptr = (PyObject *)0x0;
    local_1a = true;
    local_19 = false;
    std::vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
    ::emplace_back<char_const(&)[5],decltype(nullptr),pybind11::handle,bool,bool>
              ((vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
                *)(ctx + 0x18),(char (*) [5])0x409b70,&local_30,&local_28,&local_1a,&local_19);
  }
  local_30 = (void *)0x0;
  local_28.m_ptr = (PyObject *)0x0;
  local_1a = (bool)(~(byte)this[8] & 1);
  local_19 = (bool)((byte)this[8] >> 1 & 1);
  pvVar1 = std::
           vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
           ::emplace_back<char_const*const&,decltype(nullptr),pybind11::handle,bool,bool_const&>
                     ((vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
                       *)(ctx + 0x18),(char **)this,&local_30,&local_28,&local_1a,&local_19);
  if (((byte)ctx[0x59] & 0x80) != 0) {
    pvVar1 = *(reference *)this;
    if ((pvVar1 == (reference)0x0) || (*(char *)&pvVar1->name == '\0')) {
      pybind11_fail("arg(): cannot specify an unnamed argument after an kw_only() annotation");
    }
    *(short *)(ctx + 0x5e) = *(short *)(ctx + 0x5e) + 1;
  }
  return (int)pvVar1;
}

Assistant:

static void init(const arg &a, function_record *r) {
        if (r->is_method && r->args.empty())
            r->args.emplace_back("self", nullptr, handle(), true /*convert*/, false /*none not allowed*/);
        r->args.emplace_back(a.name, nullptr, handle(), !a.flag_noconvert, a.flag_none);

        if (r->has_kw_only_args) process_kw_only_arg(a, r);
    }